

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

CheckerSymbol * slang::ast::CheckerSymbol::fromSyntax(Scope *scope,CheckerDeclarationSyntax *syntax)

{
  undefined1 *puVar1;
  SyntaxKind SVar2;
  SyntaxNode *syntax_00;
  DataTypeSyntax *syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  AssertionPortSymbol *pAVar3;
  CheckerSymbol *pCVar4;
  bool bVar5;
  ArgumentDirection AVar6;
  int iVar7;
  AssertionItemPortSyntax *pAVar8;
  Diagnostic *diag;
  undefined4 extraout_var;
  iterator_base<slang::syntax::AssertionItemPortSyntax_*> *extraout_RDX;
  iterator_base<slang::syntax::AssertionItemPortSyntax_*> *src;
  iterator_base<slang::syntax::AssertionItemPortSyntax_*> *extraout_RDX_00;
  size_t extraout_RDX_01;
  Compilation *args;
  SourceRange SVar9;
  AssertionPortSymbol *port;
  iterator __begin3;
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> ports;
  SyntaxNode *local_d8;
  AssertionPortSymbol *local_d0;
  CheckerSymbol *local_c8;
  Type *local_c0;
  Scope *local_b8;
  iterator_base<slang::syntax::AssertionItemPortSyntax_*> local_b0;
  ulong local_a0;
  SourceLocation local_98;
  Token *local_90;
  SourceLocation local_88;
  string_view local_80;
  SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> local_70 [2];
  
  args = scope->compilation;
  local_70[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&syntax->name);
  local_b0.list = (ParentList *)parsing::Token::location(&syntax->name);
  local_c8 = BumpAllocator::
             emplace<slang::ast::CheckerSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       (&args->super_BumpAllocator,args,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_70,
                        (SourceLocation *)&local_b0);
  (local_c8->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_02._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_02._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&local_c8->super_Symbol,scope,syntax_02);
  local_70[0].len = 0;
  local_70[0].data_ = (pointer)((long)local_70 + 0x18);
  local_70[0].cap = 5;
  src = extraout_RDX;
  if (syntax->portList != (AssertionItemPortListSyntax *)0x0) {
    local_c0 = Compilation::getType(args,Untyped);
    local_b0.list = &syntax->portList->ports;
    src = &local_b0;
    local_b0.index = 0;
    local_a0 = (syntax->portList->ports).elements._M_extent._M_extent_value + 1 >> 1;
    local_b8 = &local_c8->super_Scope;
    AVar6 = In;
    local_d8 = (SyntaxNode *)0x0;
    local_98 = (SourceLocation)local_b0.list;
    for (; ((SourceLocation)local_b0.list != local_98 || (local_b0.index != local_a0));
        local_b0.index = local_b0.index + 1) {
      pAVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::
               iterator_base<slang::syntax::AssertionItemPortSyntax_*>::dereference(&local_b0);
      syntax_00 = (pAVar8->super_SyntaxNode).previewNode;
      if (syntax_00 != (SyntaxNode *)0x0) {
        Scope::addMembers(local_b8,syntax_00);
      }
      local_80 = parsing::Token::valueText(&pAVar8->name);
      local_88 = parsing::Token::location(&pAVar8->name);
      local_d0 = BumpAllocator::
                 emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                           (&args->super_BumpAllocator,&local_80,&local_88);
      (local_d0->super_Symbol).originatingSyntax = &pAVar8->super_SyntaxNode;
      syntax_03._M_ptr =
           (pAVar8->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_03._M_extent._M_extent_value =
           (pAVar8->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(&local_d0->super_Symbol,scope,syntax_03);
      if ((pAVar8->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value != 0) {
        DeclaredType::setDimensionSyntax(&local_d0->declaredType,&pAVar8->dimensions);
      }
      if ((pAVar8->local).info != (Info *)0x0) {
        SVar9 = parsing::Token::range(&pAVar8->local);
        Scope::addDiag(scope,(DiagCode)0x18000a,SVar9);
      }
      if ((pAVar8->direction).info != (Info *)0x0) {
        AVar6 = SemanticFacts::getDirection((pAVar8->direction).kind);
        local_d8 = (SyntaxNode *)0x0;
      }
      pAVar3 = local_d0;
      (local_d0->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection> =
           (_Optional_payload_base<slang::ast::ArgumentDirection>)((ulong)AVar6 | 0x100000000);
      syntax_01 = (pAVar8->type).ptr;
      local_90 = &pAVar8->direction;
      bVar5 = isEmptyType(syntax_01);
      if (bVar5) {
        if (local_d8 == (SyntaxNode *)0x0) {
          (pAVar3->declaredType).type = local_c0;
          if ((pAVar8->dimensions).
              super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent
              ._M_extent_value != 0) {
            SVar9 = slang::syntax::SyntaxNode::sourceRange
                              (&(pAVar8->dimensions).super_SyntaxListBase.super_SyntaxNode);
            diag = Scope::addDiag(scope,(DiagCode)0xb0009,SVar9);
            ast::operator<<(diag,local_c0);
          }
          if ((pAVar8->direction).info != (Info *)0x0) {
            SVar9 = parsing::Token::range(local_90);
            Scope::addDiag(scope,(DiagCode)0x170006,SVar9);
          }
          local_d8 = (SyntaxNode *)0x0;
        }
        else {
          (pAVar3->declaredType).typeOrLink.typeSyntax = (DataTypeSyntax *)local_d8;
          puVar1 = &(pAVar3->declaredType).field_0x3f;
          *puVar1 = *puVar1 & 0x7f;
        }
      }
      else {
        (pAVar3->declaredType).typeOrLink.typeSyntax = syntax_01;
        puVar1 = &(pAVar3->declaredType).field_0x3f;
        *puVar1 = *puVar1 & 0x7f;
        local_d8 = (SyntaxNode *)(pAVar8->type).ptr;
        if ((((pAVar3->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged ==
              true) && (AVar6 == Out)) &&
           ((SVar2 = local_d8->kind, SVar2 == PropertyType ||
            ((SVar2 == Untyped || (SVar2 == SequenceType)))))) {
          SVar9 = slang::syntax::SyntaxNode::sourceRange(local_d8);
          Scope::addDiag(scope,(DiagCode)0x150006,SVar9);
          (local_d0->declaredType).type = args->errorType;
        }
      }
      AVar6 = (local_d0->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload.
              _M_value;
      if (pAVar8->defaultValue != (EqualsAssertionArgClauseSyntax *)0x0) {
        local_d0->defaultValueSyntax = (pAVar8->defaultValue->expr).ptr;
      }
      Scope::addMember(local_b8,&local_d0->super_Symbol);
      SmallVectorBase<slang::ast::AssertionPortSymbol_const*>::
      emplace_back<slang::ast::AssertionPortSymbol_const*const&>
                ((SmallVectorBase<slang::ast::AssertionPortSymbol_const*> *)local_70,&local_d0);
      src = extraout_RDX_00;
    }
  }
  iVar7 = SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)args,(EVP_PKEY_CTX *)src);
  pCVar4 = local_c8;
  (local_c8->ports)._M_ptr = (pointer)CONCAT44(extraout_var,iVar7);
  (local_c8->ports)._M_extent._M_extent_value = extraout_RDX_01;
  SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::cleanup(local_70,(EVP_PKEY_CTX *)args);
  return pCVar4;
}

Assistant:

CheckerSymbol& CheckerSymbol::fromSyntax(const Scope& scope,
                                         const CheckerDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CheckerSymbol>(comp, syntax.name.valueText(),
                                              syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    SmallVector<const AssertionPortSymbol*> ports;
    if (syntax.portList) {
        // Checker port symbols differ enough in their rules that we
        // don't try to reuse buildPorts here.
        auto& untyped = comp.getType(SyntaxKind::Untyped);
        const DataTypeSyntax* lastType = nullptr;
        ArgumentDirection lastDir = ArgumentDirection::In;

        for (auto item : syntax.portList->ports) {
            if (item->previewNode)
                result->addMembers(*item->previewNode);

            auto port = comp.emplace<AssertionPortSymbol>(item->name.valueText(),
                                                          item->name.location());
            port->setSyntax(*item);
            port->setAttributes(scope, item->attributes);

            if (!item->dimensions.empty())
                port->declaredType.setDimensionSyntax(item->dimensions);

            if (item->local)
                scope.addDiag(diag::LocalNotAllowed, item->local.range());

            if (item->direction) {
                port->direction = SemanticFacts::getDirection(item->direction.kind);

                // If we have a direction we can never inherit the previous type.
                lastType = nullptr;
            }
            else {
                port->direction = lastDir;
            }

            if (isEmptyType(*item->type)) {
                if (lastType)
                    port->declaredType.setTypeSyntax(*lastType);
                else {
                    port->declaredType.setType(untyped);
                    if (!item->dimensions.empty()) {
                        scope.addDiag(diag::InvalidArrayElemType, item->dimensions.sourceRange())
                            << untyped;
                    }

                    if (item->direction)
                        scope.addDiag(diag::CheckerPortDirectionType, item->direction.range());
                }
            }
            else {
                port->declaredType.setTypeSyntax(*item->type);
                lastType = item->type;

                auto itemKind = item->type->kind;
                if (port->direction == ArgumentDirection::Out &&
                    (itemKind == SyntaxKind::PropertyType || itemKind == SyntaxKind::SequenceType ||
                     itemKind == SyntaxKind::Untyped)) {
                    scope.addDiag(diag::CheckerOutputBadType, item->type->sourceRange());
                    port->declaredType.setType(comp.getErrorType());
                }
            }

            lastDir = *port->direction;
            if (item->defaultValue)
                port->defaultValueSyntax = item->defaultValue->expr;

            result->addMember(*port);
            ports.push_back(port);
        }
    }
    result->ports = ports.copy(comp);

    return *result;
}